

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QDockWidgetGroupWindow::destroyIfSingleItemLeft(QDockWidgetGroupWindow *this)

{
  QWidget *widget;
  QLayout *pQVar1;
  QMainWindowLayout *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_58;
  QArrayDataPointer<QDockWidget_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  dockWidgets((QList<QDockWidget_*> *)&local_40,this);
  if (local_40.size == 1) {
    widget = &(*local_40.ptr)->super_QWidget;
    pQVar1 = QWidget::layout((QWidget *)this);
    QDockAreaLayoutInfo::indexOf
              ((QList<int> *)&QStack_58,(QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem,widget);
    QArrayDataPointer<int>::~QArrayDataPointer(&QStack_58);
    if (QStack_58.size != 0) {
      this_00 = qt_mainwindow_layout(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
      QMainWindowLayout::unplug((QMainWindowLayout *)this_00,widget,Widget);
      QWidget::setGeometry(widget,(QRect *)(*(long *)(this + 0x20) + 0x14));
      QWidget::hide((QWidget *)this);
      reparentToMainWindow(this,(QDockWidget *)widget);
      pQVar1 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::deleteAllLayoutItems((QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem)
      ;
      pQVar1 = QWidget::layout((QWidget *)this);
      QList<QDockAreaLayoutItem>::clear((QList<QDockAreaLayoutItem> *)&pQVar1[6].super_QLayoutItem);
      destroyOrHideIfEmpty(this);
    }
  }
  QArrayDataPointer<QDockWidget_*>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::destroyIfSingleItemLeft()
{
    const auto &dockWidgets = this->dockWidgets();

    // Handle only the last dock
    if (dockWidgets.count() != 1)
        return;

    auto *lastDockWidget = dockWidgets.at(0);

    // If the last remaining dock widget is not in the group window's item_list,
    // a group window is being docked on a main window docking area.
    // => don't interfere
    if (layoutInfo()->indexOf(lastDockWidget).isEmpty())
        return;

    Q_ASSERT(qobject_cast<QMainWindow *>(parentWidget()));
    auto *mainWindow = static_cast<QMainWindow *>(parentWidget());
    QMainWindowLayout *mwLayout = qt_mainwindow_layout(mainWindow);

    // Unplug the last remaining dock widget and hide the group window, to avoid flickering
    mwLayout->unplug(lastDockWidget, QDockWidgetPrivate::DragScope::Widget);
    lastDockWidget->setGeometry(geometry());
    hide();

    // Re-parent last dock widget
    reparentToMainWindow(lastDockWidget);

    // the group window could still have placeholder items => clear everything
    layoutInfo()->deleteAllLayoutItems();
    layoutInfo()->item_list.clear();

    destroyOrHideIfEmpty();
}